

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_spurious_unsub_does_not_affect_subscriptions_Test::TestBody
          (SubjectSetRegisterTest_test_spurious_unsub_does_not_affect_subscriptions_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertionResult gtest_ar_;
  SubjectSetRegister subject_register;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  AssertHelper local_120;
  internal local_118 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  undefined1 local_108 [104];
  bool local_a0;
  SubjectSetRegister local_98 [48];
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  local_68 [48];
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  local_38 [48];
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_98);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_98);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  local_118[0] = (internal)(local_a0 ^ 1);
  local_110.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)local_108);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,local_118,
               (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x33a,(char *)local_108._0_8_);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if (local_128.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_128.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_98);
    bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
    local_118[0] = (internal)(local_a0 ^ 1);
    local_110.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
              ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)local_108
              );
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_128);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_108,local_118,
                 (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
                 ,0x33d,(char *)local_108._0_8_);
      testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      if (local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_128.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_128.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_98);
      bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
      local_118[0] = (internal)(local_a0 ^ 1);
      local_110.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
                ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
                 local_108);
      if (local_118[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_128);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_108,local_118,
                   (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
                   ,0x340,(char *)local_108._0_8_);
        testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_120);
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
        }
        if (local_128.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_128.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_128.ptr_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_98);
        bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
        local_118[0] = (internal)(local_a0 ^ 1);
        local_110.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
                  ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
                   local_108);
        if (local_a0 != false) {
          testing::Message::Message((Message *)&local_128);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_108,local_118,
                     (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_120,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
                     ,0x343,(char *)local_108._0_8_);
          testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_128);
          testing::internal::AssertHelper::~AssertHelper(&local_120);
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
          }
          if (local_128.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_128.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_128.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  ::~_Rb_tree(local_38);
  std::
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  ::~_Rb_tree(local_68);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_spurious_unsub_does_not_affect_subscriptions)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Unregister(SS_SUBJECT0);
    ASSERT_FALSE(subject_register.NextSubscriptionSync());

    subject_register.Unregister(SS_SUBJECT0);
    ASSERT_FALSE(subject_register.NextSubscriptionSync());

    subject_register.Unregister(SS_SUBJECT0);
    ASSERT_FALSE(subject_register.NextSubscriptionSync());

    subject_register.Unregister(SS_SUBJECT1);
    ASSERT_FALSE(subject_register.NextSubscriptionSync());
}